

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3MatchinfoFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  long lVar1;
  int iVar2;
  Fts3Cursor *in_RDX;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  char *zArg;
  Fts3Cursor *pCsr;
  uchar *zArg_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = fts3FunctionArg((sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,
                          (sqlite3_value *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                          (Fts3Cursor **)in_RDX);
  if (iVar2 == 0) {
    zArg_00 = (uchar *)0x0;
    if (1 < in_ESI) {
      zArg_00 = sqlite3_value_text((sqlite3_value *)0x25c927);
    }
    sqlite3Fts3Matchinfo
              ((sqlite3_context *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_RDX,(char *)zArg_00)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3MatchinfoFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */
  assert( nVal==1 || nVal==2 );
  if( SQLITE_OK==fts3FunctionArg(pContext, "matchinfo", apVal[0], &pCsr) ){
    const char *zArg = 0;
    if( nVal>1 ){
      zArg = (const char *)sqlite3_value_text(apVal[1]);
    }
    sqlite3Fts3Matchinfo(pContext, pCsr, zArg);
  }
}